

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh_fixture.c
# Opt level: O2

int run_command(char **output,char *command,...)

{
  char in_AL;
  uint uVar1;
  size_t sVar2;
  FILE *__stream;
  char *pcVar3;
  ulong uVar4;
  ushort **ppuVar5;
  undefined8 in_RCX;
  long lVar6;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined1 local_40e8 [16];
  undefined8 local_40d8;
  undefined8 local_40d0;
  undefined8 local_40c8;
  undefined8 local_40c0;
  undefined8 local_40b8;
  undefined8 local_40a8;
  undefined8 local_4098;
  undefined8 local_4088;
  undefined8 local_4078;
  undefined8 local_4068;
  undefined8 local_4058;
  undefined8 local_4048;
  char acStack_4039 [8209];
  char command_buf [8192];
  
  args[0].reg_save_area = local_40e8;
  if (in_AL != '\0') {
    local_40b8 = in_XMM0_Qa;
    local_40a8 = in_XMM1_Qa;
    local_4098 = in_XMM2_Qa;
    local_4088 = in_XMM3_Qa;
    local_4078 = in_XMM4_Qa;
    local_4068 = in_XMM5_Qa;
    local_4058 = in_XMM6_Qa;
    local_4048 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].gp_offset = 0x10;
  args[0].fp_offset = 0x30;
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  local_40d8 = in_RDX;
  local_40d0 = in_RCX;
  local_40c8 = in_R8;
  local_40c0 = in_R9;
  uVar1 = vsnprintf(command_buf,0x2000,command,args);
  if (uVar1 < 0x2000) {
    sVar2 = strlen(command_buf);
    if ((sVar2 - 0x2001 < 0xffffffffffffdff8) ||
       (uVar1 = snprintf(acStack_4039 + 1,0x2008,"%s 2>&1",command_buf), 0x1fff < uVar1)) {
      pcVar3 = "Unable to rewrite command (%s)\n";
    }
    else {
      fprintf(_stdout,"Command: %s\n",command_buf);
      __stream = popen(acStack_4039 + 1,"r");
      if (__stream != (FILE *)0x0) {
        acStack_4039[1] = 0;
        uVar4 = 0;
        while ((uVar4 < 0x2007 &&
               (pcVar3 = fgets(acStack_4039 + uVar4 + 1,0x2008 - (int)uVar4,__stream),
               pcVar3 != (char *)0x0))) {
          uVar4 = strlen(acStack_4039 + 1);
        }
        uVar1 = pclose(__stream);
        if (uVar1 != 0) {
          fprintf(_stderr,"Error running command \'%s\' (exit %d): %s\n",command,(ulong)uVar1,
                  acStack_4039 + 1);
        }
        if (output == (char **)0x0) {
          return uVar1;
        }
        sVar2 = strlen(acStack_4039 + 1);
        if (sVar2 != 0) {
          ppuVar5 = __ctype_b_loc();
          lVar6 = (long)acStack_4039[sVar2];
          while ((*(byte *)((long)*ppuVar5 + lVar6 * 2 + 1) & 0x20) != 0) {
            acStack_4039[sVar2] = '\0';
            lVar6 = 0;
          }
        }
        pcVar3 = strdup(acStack_4039 + 1);
        *output = pcVar3;
        return uVar1;
      }
      pcVar3 = "Unable to execute command \'%s\'\n";
    }
  }
  else {
    pcVar3 = "Unable to format command (%s)\n";
  }
  fprintf(_stderr,pcVar3,command);
  return -1;
}

Assistant:

static int run_command(char **output, const char *command, ...)
{
    va_list args;
    int ret;

    va_start(args, command);
    ret = run_command_varg(output, command, args);
    va_end(args);

    return ret;
}